

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_throwobject(HSQUIRRELVM v)

{
  SQInteger in_RDI;
  SQObjectPtr *in_stack_00000008;
  SQObjectPtr *in_stack_00000010;
  
  SQVM::GetUp(v,in_RDI);
  SQObjectPtr::operator=(in_stack_00000010,in_stack_00000008);
  SQVM::Pop((SQVM *)0x11988e);
  return -1;
}

Assistant:

SQRESULT sq_throwobject(HSQUIRRELVM v)
{
    v->_lasterror = v->GetUp(-1);
    v->Pop();
    return SQ_ERROR;
}